

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O0

int xmlXPathIsNodeType(xmlChar *name)

{
  int iVar1;
  xmlChar *name_local;
  
  if (name == (xmlChar *)0x0) {
    name_local._4_4_ = 0;
  }
  else {
    iVar1 = xmlStrEqual(name,"node");
    if (iVar1 == 0) {
      iVar1 = xmlStrEqual(name,"text");
      if (iVar1 == 0) {
        iVar1 = xmlStrEqual(name,"comment");
        if (iVar1 == 0) {
          iVar1 = xmlStrEqual(name,(xmlChar *)"processing-instruction");
          if (iVar1 == 0) {
            name_local._4_4_ = 0;
          }
          else {
            name_local._4_4_ = 1;
          }
        }
        else {
          name_local._4_4_ = 1;
        }
      }
      else {
        name_local._4_4_ = 1;
      }
    }
    else {
      name_local._4_4_ = 1;
    }
  }
  return name_local._4_4_;
}

Assistant:

int
xmlXPathIsNodeType(const xmlChar *name) {
    if (name == NULL)
	return(0);

    if (xmlStrEqual(name, BAD_CAST "node"))
	return(1);
    if (xmlStrEqual(name, BAD_CAST "text"))
	return(1);
    if (xmlStrEqual(name, BAD_CAST "comment"))
	return(1);
    if (xmlStrEqual(name, BAD_CAST "processing-instruction"))
	return(1);
    return(0);
}